

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

short chaiscript::boxed_cast<short>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  short sVar1;
  element_type *peVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  short *psVar6;
  undefined8 *puVar7;
  undefined1 local_68 [72];
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68._0_8_ = &short::typeinfo;
    local_68._8_8_ = &short::typeinfo;
    local_68._16_4_ = 0x10;
    bVar5 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_68);
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<short>((t_conversions->m_conversions)._M_data),
       bVar5)) {
      if ((t_conversions != (Type_Conversions_State *)0x0) &&
         (bVar5 = Type_Conversions::convertable_type<short>((t_conversions->m_conversions)._M_data),
         bVar5)) {
        local_68._24_8_ = &short::typeinfo;
        local_68._32_8_ = &short::typeinfo;
        local_68._40_4_ = 0x10;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_68,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)(local_68 + 0x18),
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        psVar6 = (short *)detail::verify_type<void>
                                    ((Boxed_Value *)local_68,(type_info *)&short::typeinfo,
                                     *(void **)(local_68._0_8_ + 0x28));
        sVar1 = *psVar6;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return sVar1;
        }
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        return sVar1;
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar2 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68._16_4_ = (peVar2->m_type_info).m_flags;
      local_68._20_4_ = *(undefined4 *)&(peVar2->m_type_info).field_0x14;
      ptVar3 = (peVar2->m_type_info).m_type_info;
      ptVar4 = (peVar2->m_type_info).m_bare_type_info;
      *puVar7 = &PTR__bad_cast_005a4ab0;
      local_68._0_4_ = SUB84(ptVar3,0);
      local_68._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      local_68._8_4_ = SUB84(ptVar4,0);
      local_68._12_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
      *(undefined4 *)(puVar7 + 1) = local_68._0_4_;
      *(undefined4 *)((long)puVar7 + 0xc) = local_68._4_4_;
      *(undefined4 *)(puVar7 + 2) = local_68._8_4_;
      *(undefined4 *)((long)puVar7 + 0x14) = local_68._12_4_;
      puVar7[3] = local_68._16_8_;
      puVar7[4] = &short::typeinfo;
      puVar7[5] = 0x19;
      puVar7[6] = "Cannot perform boxed_cast";
      local_68._0_8_ = ptVar3;
      local_68._8_8_ = ptVar4;
      __cxa_throw(puVar7,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  psVar6 = (short *)detail::verify_type<void>
                              (bv,(type_info *)&short::typeinfo,
                               ((bv->m_data).
                                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_const_data_ptr);
  return *psVar6;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }